

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  int iVar1;
  size_t sVar2;
  string *extraout_RAX;
  string *psVar3;
  ostream *poVar4;
  size_type sVar5;
  string full_flag;
  char local_41;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  string local_38;
  
  Message::Message((Message *)&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_40._M_head_impl + 0x10),"gtest_",6);
  poVar4 = (ostream *)(local_40._M_head_impl + 0x10);
  if (this == (internal *)0x0) {
    sVar2 = 6;
    this = (internal *)"(null)";
  }
  else {
    sVar2 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)this,sVar2);
  StringStreamToString(&local_38,local_40._M_head_impl);
  if (local_40._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  Message::Message((Message *)&local_40);
  if (local_38._M_string_length != 0) {
    sVar5 = 0;
    do {
      iVar1 = toupper((uint)(byte)local_38._M_dataplus._M_p[sVar5]);
      local_41 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40._M_head_impl + 0x10),&local_41,1);
      sVar5 = sVar5 + 1;
    } while (sVar5 != local_38._M_string_length);
  }
  StringStreamToString(__return_storage_ptr__,local_40._M_head_impl);
  if (local_40._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  psVar3 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar3) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}